

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool tinygltf::ParseParameterProperty
               (Parameter *param,string *err,json *o,string *prop,bool required)

{
  string *psVar1;
  string *psVar2;
  json *pjVar3;
  bool bVar4;
  string *psVar5;
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [48];
  string local_58 [39];
  byte local_31;
  string *psStack_30;
  bool required_local;
  string *prop_local;
  json *o_local;
  string *err_local;
  Parameter *param_local;
  
  local_31 = required;
  psStack_30 = prop;
  prop_local = (string *)o;
  o_local = (json *)err;
  err_local = (string *)param;
  std::__cxx11::string::string(local_58);
  bVar4 = ParseStringProperty(&param->string_value,err,o,prop,false,(string *)local_58);
  std::__cxx11::string::~string(local_58);
  pjVar3 = o_local;
  psVar2 = prop_local;
  psVar1 = psStack_30;
  if (bVar4) {
    param_local._7_1_ = true;
  }
  else {
    psVar5 = err_local + 0x28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"",&local_89);
    bVar4 = ParseNumberArrayProperty
                      ((vector<double,_std::allocator<double>_> *)psVar5,(string *)pjVar3,
                       (json *)psVar2,psVar1,false,(string *)local_88);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    pjVar3 = o_local;
    psVar2 = prop_local;
    psVar1 = psStack_30;
    if (bVar4) {
      param_local._7_1_ = true;
    }
    else {
      psVar5 = err_local + 0x70;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,"",&local_b1);
      bVar4 = ParseNumberProperty((double *)psVar5,(string *)pjVar3,(json *)psVar2,psVar1,false,
                                  (string *)local_b0);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      if (bVar4) {
        err_local[1] = (string)0x1;
        param_local._7_1_ = true;
      }
      else {
        bVar4 = ParseJSONProperty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                   *)(err_local + 0x40),(string *)o_local,(json *)prop_local,
                                  psStack_30,false);
        psVar5 = err_local;
        pjVar3 = o_local;
        psVar2 = prop_local;
        psVar1 = psStack_30;
        if (bVar4) {
          param_local._7_1_ = true;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_d8,"",&local_d9);
          bVar4 = ParseBooleanProperty
                            ((bool *)psVar5,(string *)pjVar3,(json *)psVar2,psVar1,false,
                             (string *)local_d8);
          std::__cxx11::string::~string(local_d8);
          std::allocator<char>::~allocator((allocator<char> *)&local_d9);
          if (bVar4) {
            param_local._7_1_ = true;
          }
          else {
            if (((local_31 & 1) != 0) && (o_local != (json *)0x0)) {
              std::__cxx11::string::operator+=
                        ((string *)o_local,"parameter must be a string or number / number array.\n")
              ;
            }
            param_local._7_1_ = false;
          }
        }
      }
    }
  }
  return param_local._7_1_;
}

Assistant:

static bool ParseParameterProperty(Parameter *param, std::string *err,
                                   const detail::json &o,
                                   const std::string &prop, bool required) {
  // A parameter value can either be a string or an array of either a boolean or
  // a number. Booleans of any kind aren't supported here. Granted, it
  // complicates the Parameter structure and breaks it semantically in the sense
  // that the client probably works off the assumption that if the string is
  // empty the vector is used, etc. Would a tagged union work?
  if (ParseStringProperty(&param->string_value, err, o, prop, false)) {
    // Found string property.
    return true;
  } else if (ParseNumberArrayProperty(&param->number_array, err, o, prop,
                                      false)) {
    // Found a number array.
    return true;
  } else if (ParseNumberProperty(&param->number_value, err, o, prop, false)) {
    param->has_number_value = true;
    return true;
  } else if (ParseJSONProperty(&param->json_double_value, err, o, prop,
                               false)) {
    return true;
  } else if (ParseBooleanProperty(&param->bool_value, err, o, prop, false)) {
    return true;
  } else {
    if (required) {
      if (err) {
        (*err) += "parameter must be a string or number / number array.\n";
      }
    }
    return false;
  }
}